

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O0

bool ImGui::TreeNodeCbxLinkHelp
               (char *label,int nCol,dataRefsLT idxCbx,char *cbxPopup,char *linkLabel,char *linkURL,
               char *linkPopup,char *helpURL,char *helpPopup,char *filter,int nOpCl,
               ImGuiTreeNodeFlags flags)

{
  int iVar1;
  string *in_RCX;
  int in_EDX;
  ImU32 in_ESI;
  undefined8 in_RDI;
  long in_R8;
  long in_R9;
  char *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  ImVec2 *in_stack_00000020;
  int in_stack_00000028;
  bool b;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  dataRefsLT idx;
  ImVec4 *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  char *pcVar2;
  undefined1 rightAligned;
  char *in_stack_ffffffffffffff88;
  ImU32 in_stack_ffffffffffffff90;
  ImGuiCol in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  ImVec2 local_3c;
  byte local_31;
  long local_30;
  long local_28;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  if ((in_stack_00000020 == (ImVec2 *)0x0) || (*(char *)&in_stack_00000020->x == '\0')) {
    local_30 = in_R9;
    local_28 = in_R8;
    iVar1 = TableGetColumnIndex();
    if (0 < iVar1) {
      TableNextRow((ImGuiTableRowFlags)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                   SUB84(in_stack_ffffffffffffff60,0));
    }
    GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                SUB84(in_stack_ffffffffffffff70,0));
    PushStyleColor(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
    GetStyleColorVec4(0x2d);
    PushStyleColor((ImGuiCol)((ulong)in_stack_ffffffffffffff80 >> 0x20),in_stack_ffffffffffffff78);
    rightAligned = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
    PushID(in_stack_ffffffffffffff70);
    idx = (dataRefsLT)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    if (in_stack_00000028 != 0) {
      SetNextItemOpen(0 < in_stack_00000028,0);
    }
    local_31 = TreeNodeEx(in_stack_ffffffffffffff68,
                          (ImGuiTreeNodeFlags)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    TableNextCell();
    if (in_EDX < 0x6f) {
      CheckboxDr((char *)in_stack_ffffffffffffff78,idx,in_stack_ffffffffffffff68);
      SameLine((float)((ulong)in_stack_ffffffffffffff60 >> 0x20),SUB84(in_stack_ffffffffffffff60,0))
      ;
    }
    if ((local_28 == 0) || (local_30 == 0)) {
      if ((local_28 != 0) && (local_30 == 0)) {
        TextUnformatted(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        if ((in_stack_00000008 != (char *)0x0) &&
           (bVar3 = IsItemHovered((ImGuiHoveredFlags)in_stack_ffffffffffffff60), bVar3)) {
          SetTooltip("%s",in_stack_00000008);
        }
        SameLine((float)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                 SUB84(in_stack_ffffffffffffff60,0));
      }
    }
    else {
      pcVar2 = in_stack_00000008;
      ImVec2::ImVec2(&local_3c,0.0,0.0);
      rightAligned = (undefined1)((ulong)pcVar2 >> 0x38);
      ButtonURL(in_stack_00000008,unaff_retaddr,
                (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                SUB81((ulong)in_RDI >> 0x38,0),(ImU32)in_RDI,in_ESI,in_stack_00000020);
      SameLine((float)((ulong)in_stack_ffffffffffffff60 >> 0x20),SUB84(in_stack_ffffffffffffff60,0))
      ;
    }
    if (in_stack_00000010 != (char *)0x0) {
      iVar1 = TableGetColumnIndex();
      if (iVar1 < (int)(in_ESI - 1)) {
        TableSetColumnIndex((int)in_stack_ffffffffffffff60);
      }
      bVar3 = ButtonIcon((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88,(bool)rightAligned);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
        ;
        LTOpenHelp(in_RCX);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
        in_stack_ffffffffffffff60 = in_stack_00000010;
      }
    }
    PopID();
    TableNextRow((ImGuiTableRowFlags)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                 SUB84(in_stack_ffffffffffffff60,0));
    PopStyleColor((int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    bVar3 = (bool)(local_31 & 1);
  }
  else {
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

IMGUI_API bool TreeNodeCbxLinkHelp(const char* label, int nCol,
                                   dataRefsLT idxCbx, const char* cbxPopup,
                                   const char* linkLabel, const char* linkURL, const char* linkPopup,
                                   const char* helpURL, const char* helpPopup,
                                   const char* filter, int nOpCl,
                                   ImGuiTreeNodeFlags flags)
{
    if (filter && *filter) return true;                     // is a filter defined? Then we don't show tree nodes
    
    if (TableGetColumnIndex() > 0)                          // make sure we start on a row's beginning
        TableNextRow();

    // Set special background color for tree nodes
    ImGui::PushStyleColor(ImGuiCol_TableRowBg, ImGui::GetColorU32(ImGuiCol_Button, 0.4f));
    ImGui::PushStyleColor(ImGuiCol_TableRowBgAlt, ImGui::GetStyleColorVec4(ImGuiCol_TableRowBg));

    // makes sure that all buttons here are recongized as different
    PushID(label);
    
    // Tree node
    if (nOpCl)                                              // if requested...
        SetNextItemOpen(nOpCl > 0);                         // ...force open/close
    const bool b = TreeNodeEx(label, flags);                // draw tree node
    
    // add a checkbox
    TableNextCell();
    if (idxCbx < CNT_DATAREFS_LT) {
        CheckboxDr("##CheckboxDr", idxCbx, cbxPopup);
        SameLine();
    }
    
    // add a button with a link action to the 2nd cell
    if (linkLabel && linkURL) {
        ButtonURL(linkLabel, linkURL, linkPopup);
        SameLine();
    }
    // Not a button, but mayby just plain text?
    else if (linkLabel && !linkURL) {
        TextUnformatted(linkLabel);
        if (linkPopup && IsItemHovered())
            SetTooltip("%s", linkPopup);
        SameLine();
    }
    
    // add a help icon button
    if (helpURL) {
        if (TableGetColumnIndex() < nCol-1)                 // move to last column
            TableSetColumnIndex(nCol-1);
        if (ButtonIcon(ICON_FA_QUESTION_CIRCLE, helpPopup, true))
            LTOpenHelp(helpURL);                            // Help button handling
    }
    
    PopID();
    TableNextRow();                                         // move to next row
    ImGui::PopStyleColor(2);                                // Restore row color

    return b;
}